

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

Regexp * re2::Regexp::Quest(Regexp *sub,ParseFlags flags)

{
  Regexp *pRVar1;
  
  if ((sub->op_ != '\t') || (pRVar1 = sub, sub->parse_flags_ != flags)) {
    pRVar1 = (Regexp *)operator_new(0x28);
    pRVar1->op_ = '\t';
    pRVar1->simple_ = '\0';
    pRVar1->parse_flags_ = (uint16)flags;
    pRVar1->ref_ = 1;
    *(undefined8 *)&pRVar1->nsub_ = 0;
    *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar1->field_7).field_3.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar1->field_7 + 0xe) = 0;
    pRVar1->nsub_ = 1;
    (pRVar1->field_5).subone_ = sub;
  }
  return pRVar1;
}

Assistant:

Regexp* Regexp::Quest(Regexp* sub, ParseFlags flags) {
  if (sub->op() == kRegexpQuest && sub->parse_flags() == flags)
    return sub;
  Regexp* re = new Regexp(kRegexpQuest, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  return re;
}